

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_parsing.c
# Opt level: O0

nbt_long_array read_long_array(char **memory,size_t *length)

{
  char *pcVar1;
  int *piVar2;
  nbt_long_array nVar3;
  int local_2c;
  int32_t i;
  size_t *length_local;
  char **memory_local;
  nbt_long_array ret;
  
  memory_local = (char **)0x0;
  if (3 < *length) {
    pcVar1 = (char *)swapped_memscan(&ret,*memory,4);
    *memory = pcVar1;
    *length = *length - 4;
    if (-1 < (int)ret.data) {
      memory_local = (char **)malloc((long)(int)ret.data << 3);
      if (memory_local == (char **)0x0) {
        piVar2 = __errno_location();
        *piVar2 = -2;
      }
      else if ((ulong)((long)(int)ret.data << 3) <= *length) {
        pcVar1 = (char *)memscan(memory_local,*memory,(long)(int)ret.data << 3);
        *memory = pcVar1;
        *length = *length + (long)(int)ret.data * -8;
        for (local_2c = 0; local_2c < (int)ret.data; local_2c = local_2c + 1) {
          be2ne(memory_local + local_2c,8);
        }
        goto LAB_00102888;
      }
    }
  }
  piVar2 = __errno_location();
  if (*piVar2 == 0) {
    piVar2 = __errno_location();
    *piVar2 = -1;
  }
  free(memory_local);
  memory_local = (char **)0x0;
LAB_00102888:
  nVar3.length = (int)ret.data;
  nVar3.data = (int64_t *)memory_local;
  nVar3._12_4_ = 0;
  return nVar3;
}

Assistant:

static struct nbt_long_array read_long_array(const char** memory, size_t* length)
{
    struct nbt_long_array ret;
    ret.data = NULL;

    READ_GENERIC(&ret.length, sizeof ret.length, swapped_memscan, goto parse_error);

    if(ret.length < 0) goto parse_error;

    CHECKED_MALLOC(ret.data, ret.length * sizeof(int64_t), goto parse_error);

    READ_GENERIC(ret.data, (size_t)ret.length * sizeof(int64_t), memscan, goto parse_error);


    // Byteswap the whole array.
    for(int32_t i = 0; i < ret.length; i++)
        be2ne(ret.data + i, sizeof(int64_t));

    return ret;

parse_error:
    if(errno == NBT_OK)
        errno = NBT_ERR;

    free(ret.data);
    ret.data = NULL;
    return ret;
}